

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_trace_file_base.cpp
# Opt level: O0

void __thiscall sc_core::sc_trace_file_base::~sc_trace_file_base(sc_trace_file_base *this)

{
  bool bVar1;
  sc_trace_file_base *in_RDI;
  int in_stack_00000054;
  char *in_stack_00000058;
  char *in_stack_00000060;
  char *in_stack_00000068;
  sc_severity in_stack_00000074;
  sc_object *in_stack_fffffffffffffff0;
  
  (in_RDI->super_sc_trace_file)._vptr_sc_trace_file = (_func_int **)&PTR___cxa_pure_virtual_00365518
  ;
  (in_RDI->super_sc_object)._vptr_sc_object = (_func_int **)&PTR_print_00365650;
  bVar1 = is_initialized(in_RDI);
  if (!bVar1) {
    filename((sc_trace_file_base *)0x2d308d);
    sc_report_handler::report
              (in_stack_00000074,in_stack_00000068,in_stack_00000060,in_stack_00000058,
               in_stack_00000054);
  }
  if (in_RDI->fp != (FILE *)0x0) {
    fclose((FILE *)in_RDI->fp);
  }
  std::__cxx11::string::~string((string *)&in_RDI->filename_);
  sc_object::~sc_object(in_stack_fffffffffffffff0);
  sc_trace_file::~sc_trace_file(&in_RDI->super_sc_trace_file);
  return;
}

Assistant:

sc_trace_file_base::~sc_trace_file_base()
{
    if( !is_initialized() )
        SC_REPORT_WARNING( SC_ID_TRACING_CLOSE_EMPTY_FILE_, filename() );

    if( fp )
        fclose(fp);

#if SC_TRACING_PHASE_CALLBACKS_ == 0
    // unregister from simcontext
    sc_get_curr_simcontext()->remove_trace_file( this );
#endif
}